

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O0

void __thiscall Liby::Channel::~Channel(Channel *this)

{
  Channel *this_local;
  
  removeChannel(this);
  std::function<void_()>::~function(&this->erroEventCallback_);
  std::function<void_()>::~function(&this->writEventCallback_);
  std::function<void_()>::~function(&this->readEventCallback_);
  return;
}

Assistant:

Channel::~Channel() { removeChannel(); }